

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aphy_impl.hpp
# Opt level: O1

StrongRef * __thiscall
aphy::ref<aphy::constraint_solver>::operator=(ref<aphy::constraint_solver> *this,StrongRef *other)

{
  Counter *pCVar1;
  
  pCVar1 = other->counter;
  if ((pCVar1 != (Counter *)0x0) &&
     ((pCVar1->strongCount).super___atomic_base<unsigned_int>._M_i != 0)) {
    LOCK();
    (pCVar1->strongCount).super___atomic_base<unsigned_int>._M_i =
         (pCVar1->strongCount).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  if (this->counter != (ref_counter<aphy::constraint_solver> *)0x0) {
    ref_counter<aphy::constraint_solver>::release(this->counter);
  }
  this->counter = pCVar1;
  return this;
}

Assistant:

StrongRef &operator=(const StrongRef &other)
    {
        auto newCounter = other.counter;
        if(newCounter)
            newCounter->retain();
        if(counter)
            counter->release();
        counter = newCounter;
        return *this;
    }